

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O2

int output_nbits(Buffer *buffer,int bits,int n)

{
  Buffer_t *pBVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  
  uVar5 = buffer->bitbuffer;
  iVar2 = buffer->bits_to_go;
  if (0x20 < iVar2 + n) {
    n = n - iVar2;
    uVar5 = uVar5 << ((byte)iVar2 & 0x1f) | bits >> ((byte)n & 0x1f) & output_nbits::mask[iVar2];
    pBVar1 = buffer->current;
    buffer->current = pBVar1 + 1;
    *pBVar1 = (Buffer_t)uVar5;
    iVar2 = 8;
  }
  uVar5 = bits & output_nbits::mask[n] | uVar5 << ((byte)n & 0x1f);
  iVar3 = n - iVar2;
  for (iVar4 = iVar2 - n; iVar4 < 1; iVar4 = iVar4 + 8) {
    iVar2 = (int)uVar5 >> ((byte)iVar3 & 0x1f);
    pBVar1 = buffer->current;
    buffer->current = pBVar1 + 1;
    *pBVar1 = (Buffer_t)iVar2;
    iVar3 = iVar3 + -8;
  }
  buffer->bitbuffer = uVar5;
  buffer->bits_to_go = iVar4;
  return iVar2;
}

Assistant:

static void
output_nbits(char *outfile, int bits, int n)
{
    /* AND mask for the right-most n bits */
    static int mask[9] = {0, 1, 3, 7, 15, 31, 63, 127, 255};
	/*
	 * insert bits at end of buffer
	 */
	buffer2 <<= n;
/*	buffer2 |= ( bits & ((1<<n)-1) ); */
	buffer2 |= ( bits & (*(mask+n)) );
	bits_to_go2 -= n;
	if (bits_to_go2 <= 0) {
		/*
		 * buffer2 full, put out top 8 bits
		 */

	        outfile[noutchar] = ((buffer2>>(-bits_to_go2)) & 0xff);

		if (noutchar < noutmax) noutchar++;
		
		bits_to_go2 += 8;
	}
	bitcount += n;
}